

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_gc_mark_external_refs_WRAP(WorkerP *w,Task *__dq_head,TD_lddmc_gc_mark_external_refs *t)

{
  TD_lddmc_gc_mark_external_refs *t_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  lddmc_gc_mark_external_refs_CALL(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(lddmc_gc_mark_external_refs)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = refs_iter(&lddmc_refs, 0, lddmc_refs.refs_size);
    while (it != NULL) {
        SPAWN(lddmc_gc_mark_rec, refs_next(&lddmc_refs, &it, lddmc_refs.refs_size));
        count++;
    }
    while (count--) {
        SYNC(lddmc_gc_mark_rec);
    }
}